

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_prefix_coding.cpp
# Opt level: O2

bool crnlib::prefix_coding::generate_decoder_tables
               (uint num_syms,uint8 *pCodesizes,decoder_tables *pTables,uint table_bits)

{
  int iVar1;
  ushort uVar2;
  uint uVar3;
  uint i;
  unsigned_short *puVar4;
  uint *__s;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint j;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint32 num;
  bool bVar15;
  uint num_codes [17];
  int aiStack_c4 [3];
  uint min_codes [16];
  uint sorted_positions [17];
  uint uStack_34;
  
  bVar15 = table_bits < 0xc;
  if (bVar15 && num_syms != 0) {
    pTables->m_num_syms = num_syms;
    num_codes[0xc] = 0;
    num_codes[0xd] = 0;
    num_codes[0xe] = 0;
    num_codes[0xf] = 0;
    num_codes[8] = 0;
    num_codes[9] = 0;
    num_codes[10] = 0;
    num_codes[0xb] = 0;
    num_codes[0x10] = 0;
    num_codes[4] = 0;
    num_codes[5] = 0;
    num_codes[6] = 0;
    num_codes[7] = 0;
    num_codes[0] = 0;
    num_codes[1] = 0;
    num_codes[2] = 0;
    num_codes[3] = 0;
    for (uVar8 = 0; num_syms != uVar8; uVar8 = uVar8 + 1) {
      if ((ulong)pCodesizes[uVar8] != 0) {
        num_codes[pCodesizes[uVar8]] = num_codes[pCodesizes[uVar8]] + 1;
      }
    }
    uVar14 = 0;
    bVar5 = 0xf;
    uVar7 = 0xffffffff;
    uVar11 = 0;
    uVar10 = 0;
    for (lVar9 = -0x10; lVar9 != 0; lVar9 = lVar9 + 1) {
      iVar12 = aiStack_c4[lVar9];
      if (iVar12 == 0) {
        pTables->m_max_codes[lVar9 + 0x10] = 0;
      }
      else {
        uVar13 = (int)lVar9 + 0x11;
        if (uVar13 <= uVar7) {
          uVar7 = uVar13;
        }
        if (uVar14 <= uVar13) {
          uVar14 = uVar13;
        }
        iVar1 = iVar12 + uVar10;
        sorted_positions[lVar9] = uVar10;
        uVar10 = uVar10 + iVar12;
        pTables->m_max_codes[lVar9 + 0x10] =
             (~(-1 << (bVar5 & 0x1f)) | iVar1 + -1 << (bVar5 & 0x1f)) + 1;
        pTables->m_val_ptrs[lVar9 + 0x10] = uVar11;
        (&uStack_34)[lVar9] = uVar11;
        uVar11 = iVar12 + uVar11;
      }
      uVar10 = uVar10 * 2;
      bVar5 = bVar5 - 1;
    }
    pTables->m_total_used_syms = uVar11;
    if (pTables->m_cur_sorted_symbol_order_size < uVar11) {
      pTables->m_cur_sorted_symbol_order_size = uVar11;
      if ((uVar11 & uVar11 - 1) != 0) {
        uVar11 = math::next_pow2(uVar11);
        if (num_syms < uVar11) {
          uVar11 = num_syms;
        }
        pTables->m_cur_sorted_symbol_order_size = uVar11;
      }
      if (pTables->m_sorted_symbol_order != (unsigned_short *)0x0) {
        crnlib_delete_array<unsigned_short>(pTables->m_sorted_symbol_order);
        pTables->m_sorted_symbol_order = (uint16 *)0x0;
        uVar11 = pTables->m_cur_sorted_symbol_order_size;
      }
      puVar4 = crnlib_new_array<unsigned_short>(uVar11);
      pTables->m_sorted_symbol_order = puVar4;
    }
    pTables->m_min_code_size = (uint8)uVar7;
    pTables->m_max_code_size = (uint8)uVar14;
    for (uVar8 = 0; num_syms != uVar8; uVar8 = uVar8 + 1) {
      uVar6 = (ulong)pCodesizes[uVar8];
      if (uVar6 != 0) {
        uVar7 = sorted_positions[uVar6];
        sorted_positions[uVar6] = uVar7 + 1;
        pTables->m_sorted_symbol_order[uVar7] = (uint16)uVar8;
      }
    }
    uVar7 = (uint)pTables->m_min_code_size;
    uVar11 = 0;
    if (uVar7 < table_bits) {
      uVar11 = table_bits;
    }
    pTables->m_table_bits = uVar11;
    if (uVar7 < table_bits) {
      num = 1 << ((byte)table_bits & 0x1f);
      if (pTables->m_cur_lookup_size < num) {
        pTables->m_cur_lookup_size = num;
        if (pTables->m_lookup != (uint *)0x0) {
          crnlib_delete_array<unsigned_int>(pTables->m_lookup);
          pTables->m_lookup = (uint32 *)0x0;
        }
        __s = crnlib_new_array<unsigned_int>(num);
        pTables->m_lookup = __s;
      }
      else {
        __s = pTables->m_lookup;
      }
      memset(__s,0xff,4L << ((byte)table_bits & 0x3f));
      for (uVar8 = 1; uVar8 != table_bits + 1; uVar8 = uVar8 + 1) {
        if (num_codes[uVar8] != 0) {
          uVar10 = min_codes[uVar8 - 1];
          uVar3 = pTables->m_max_codes[uVar8 - 1];
          iVar12 = pTables->m_max_codes[uVar8 + 0x10] - uVar10;
          bVar5 = (char)uVar11 - (char)uVar8;
          for (; (uVar3 == 0 || (uVar10 <= uVar3 - 1 >> (0x10U - (char)uVar8 & 0x1f)));
              uVar10 = uVar10 + 1) {
            uVar2 = pTables->m_sorted_symbol_order[iVar12 + uVar10];
            for (uVar13 = 0; uVar13 >> (bVar5 & 0x1f) == 0; uVar13 = uVar13 + 1) {
              pTables->m_lookup[(uVar10 << (bVar5 & 0x1f)) + uVar13] =
                   (uint)uVar2 | (int)uVar8 << 0x10;
            }
          }
        }
      }
    }
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      pTables->m_val_ptrs[lVar9] = pTables->m_val_ptrs[lVar9] - min_codes[lVar9];
    }
    pTables->m_table_max_code = 0;
    pTables->m_decode_start_code_size = (uint)pTables->m_min_code_size;
    if (uVar7 < table_bits) {
      do {
        uVar7 = table_bits - 1;
        if (table_bits == 0) goto LAB_00180b84;
        uVar8 = (ulong)table_bits;
        table_bits = uVar7;
      } while (num_codes[uVar8] == 0);
      pTables->m_table_max_code = pTables->m_max_codes[uVar7];
      uVar7 = uVar11 + 1;
      pTables->m_decode_start_code_size = uVar7;
      for (; uVar7 <= uVar14; uVar7 = uVar7 + 1) {
        if (num_codes[uVar7] != 0) {
          pTables->m_decode_start_code_size = uVar7;
          break;
        }
      }
    }
LAB_00180b84:
    pTables->m_max_codes[0x10] = 0xffffffff;
    pTables->m_val_ptrs[0x10] = 0xfffff;
    pTables->m_table_shift = 0x20 - pTables->m_table_bits;
  }
  return bVar15 && num_syms != 0;
}

Assistant:

bool generate_decoder_tables(uint num_syms, const uint8* pCodesizes, decoder_tables* pTables, uint table_bits) {
  uint min_codes[cMaxExpectedCodeSize];

  if ((!num_syms) || (table_bits > cMaxTableBits))
    return false;

  pTables->m_num_syms = num_syms;

  uint num_codes[cMaxExpectedCodeSize + 1];
  utils::zero_object(num_codes);

  for (uint i = 0; i < num_syms; i++) {
    uint c = pCodesizes[i];
    if (c)
      num_codes[c]++;
  }

  uint sorted_positions[cMaxExpectedCodeSize + 1];

  uint code = 0;

  uint total_used_syms = 0;
  uint max_code_size = 0;
  uint min_code_size = UINT_MAX;
  for (uint i = 1; i <= cMaxExpectedCodeSize; i++) {
    const uint n = num_codes[i];

    if (!n)
      pTables->m_max_codes[i - 1] = 0;  //UINT_MAX;
    else {
      min_code_size = math::minimum(min_code_size, i);
      max_code_size = math::maximum(max_code_size, i);

      min_codes[i - 1] = code;

      pTables->m_max_codes[i - 1] = code + n - 1;
      pTables->m_max_codes[i - 1] = 1 + ((pTables->m_max_codes[i - 1] << (16 - i)) | ((1 << (16 - i)) - 1));

      pTables->m_val_ptrs[i - 1] = total_used_syms;

      sorted_positions[i] = total_used_syms;

      code += n;
      total_used_syms += n;
    }

    code <<= 1;
  }

  pTables->m_total_used_syms = total_used_syms;

  if (total_used_syms > pTables->m_cur_sorted_symbol_order_size) {
    pTables->m_cur_sorted_symbol_order_size = total_used_syms;

    if (!math::is_power_of_2(total_used_syms))
      pTables->m_cur_sorted_symbol_order_size = math::minimum<uint>(num_syms, math::next_pow2(total_used_syms));

    if (pTables->m_sorted_symbol_order) {
      crnlib_delete_array(pTables->m_sorted_symbol_order);
      pTables->m_sorted_symbol_order = NULL;
    }

    pTables->m_sorted_symbol_order = crnlib_new_array<uint16>(pTables->m_cur_sorted_symbol_order_size);
  }

  pTables->m_min_code_size = static_cast<uint8>(min_code_size);
  pTables->m_max_code_size = static_cast<uint8>(max_code_size);

  for (uint i = 0; i < num_syms; i++) {
    uint c = pCodesizes[i];
    if (c) {
      CRNLIB_ASSERT(num_codes[c]);

      uint sorted_pos = sorted_positions[c]++;

      CRNLIB_ASSERT(sorted_pos < total_used_syms);

      pTables->m_sorted_symbol_order[sorted_pos] = static_cast<uint16>(i);
    }
  }

  if (table_bits <= pTables->m_min_code_size)
    table_bits = 0;
  pTables->m_table_bits = table_bits;

  if (table_bits) {
    uint table_size = 1 << table_bits;
    if (table_size > pTables->m_cur_lookup_size) {
      pTables->m_cur_lookup_size = table_size;

      if (pTables->m_lookup) {
        crnlib_delete_array(pTables->m_lookup);
        pTables->m_lookup = NULL;
      }

      pTables->m_lookup = crnlib_new_array<uint32>(table_size);
    }

    memset(pTables->m_lookup, 0xFF, static_cast<uint>(sizeof(pTables->m_lookup[0])) * (1UL << table_bits));

    for (uint codesize = 1; codesize <= table_bits; codesize++) {
      if (!num_codes[codesize])
        continue;

      const uint fillsize = table_bits - codesize;
      const uint fillnum = 1 << fillsize;

      const uint min_code = min_codes[codesize - 1];
      const uint max_code = pTables->get_unshifted_max_code(codesize);
      const uint val_ptr = pTables->m_val_ptrs[codesize - 1];

      for (uint code = min_code; code <= max_code; code++) {
        const uint sym_index = pTables->m_sorted_symbol_order[val_ptr + code - min_code];
        CRNLIB_ASSERT(pCodesizes[sym_index] == codesize);

        for (uint j = 0; j < fillnum; j++) {
          const uint t = j + (code << fillsize);

          CRNLIB_ASSERT(t < (1U << table_bits));

          CRNLIB_ASSERT(pTables->m_lookup[t] == cUINT32_MAX);

          pTables->m_lookup[t] = sym_index | (codesize << 16U);
        }
      }
    }
  }

  for (uint i = 0; i < cMaxExpectedCodeSize; i++)
    pTables->m_val_ptrs[i] -= min_codes[i];

  pTables->m_table_max_code = 0;
  pTables->m_decode_start_code_size = pTables->m_min_code_size;

  if (table_bits) {
    uint i;
    for (i = table_bits; i >= 1; i--) {
      if (num_codes[i]) {
        pTables->m_table_max_code = pTables->m_max_codes[i - 1];
        break;
      }
    }
    if (i >= 1) {
      pTables->m_decode_start_code_size = table_bits + 1;
      for (uint i = table_bits + 1; i <= max_code_size; i++) {
        if (num_codes[i]) {
          pTables->m_decode_start_code_size = i;
          break;
        }
      }
    }
  }

  // sentinels
  pTables->m_max_codes[cMaxExpectedCodeSize] = UINT_MAX;
  pTables->m_val_ptrs[cMaxExpectedCodeSize] = 0xFFFFF;

  pTables->m_table_shift = 32 - pTables->m_table_bits;

  return true;
}